

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall TPZPrInteg<TPZIntCube3D>::GetOrder(TPZPrInteg<TPZIntCube3D> *this,TPZVec<int> *ord)

{
  int64_t iVar1;
  int *piVar2;
  TPZIntCube3D *in_RSI;
  TPZVec<int> *in_RDI;
  
  iVar1 = TPZVec<int>::NElements((TPZVec<int> *)in_RSI);
  if (iVar1 < 4) {
    std::operator<<((ostream *)&std::cout,
                    "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n"
                   );
  }
  else {
    TPZIntCube3D::GetOrder(in_RSI,in_RDI);
    iVar1 = in_RDI[1].fNElements;
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,3);
    *piVar2 = (int)iVar1;
  }
  return;
}

Assistant:

void GetOrder(TPZVec<int> &ord) const override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::GetOrder(ord);
		ord[Dim-1] = fOrdKsi;
    }